

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O0

int nghttp2_pq_push(nghttp2_pq *pq,nghttp2_pq_entry *item)

{
  nghttp2_pq_entry **ppnVar1;
  size_t local_38;
  size_t ncapacity;
  void *nq;
  nghttp2_pq_entry *item_local;
  nghttp2_pq *pq_local;
  
  if (pq->capacity <= pq->length) {
    if (pq->capacity * 2 < 4) {
      local_38 = 4;
    }
    else {
      local_38 = pq->capacity << 1;
    }
    ppnVar1 = (nghttp2_pq_entry **)nghttp2_mem_realloc(pq->mem,pq->q,local_38 << 3);
    if (ppnVar1 == (nghttp2_pq_entry **)0x0) {
      return -0x385;
    }
    pq->capacity = local_38;
    pq->q = ppnVar1;
  }
  pq->q[pq->length] = item;
  item->index = pq->length;
  pq->length = pq->length + 1;
  bubble_up(pq,pq->length - 1);
  return 0;
}

Assistant:

int nghttp2_pq_push(nghttp2_pq *pq, nghttp2_pq_entry *item) {
  if (pq->capacity <= pq->length) {
    void *nq;
    size_t ncapacity;

    ncapacity = nghttp2_max(4, (pq->capacity * 2));

    nq = nghttp2_mem_realloc(pq->mem, pq->q,
                             ncapacity * sizeof(nghttp2_pq_entry *));
    if (nq == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }
    pq->capacity = ncapacity;
    pq->q = nq;
  }
  pq->q[pq->length] = item;
  item->index = pq->length;
  ++pq->length;
  bubble_up(pq, pq->length - 1);
  return 0;
}